

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::AddSignalSemaphore
          (DeviceContextVkImpl *this,ManagedSemaphore *pSignalSemaphore)

{
  char (*in_RCX) [28];
  string msg;
  ManagedSemaphore *local_38;
  string local_30;
  
  local_38 = pSignalSemaphore;
  if (pSignalSemaphore == (ManagedSemaphore *)0x0) {
    FormatString<char[26],char[28]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pSignalSemaphore != nullptr",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"AddSignalSemaphore",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
               ,0x15d);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>,std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>>>
  ::
  emplace_back<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>*&>
            ((vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>,std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>>>
              *)&this->m_SignalManagedSemaphores,&local_38);
  local_30._M_dataplus._M_p = (pointer)(local_38->m_VkObject).m_VkObject;
  std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::emplace_back<VkSemaphore_T*>
            ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)&this->m_VkSignalSemaphores,
             (VkSemaphore_T **)&local_30);
  local_30._M_dataplus._M_p = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->m_SignalSemaphoreValues,(unsigned_long *)&local_30);
  return;
}

Assistant:

void AddSignalSemaphore(ManagedSemaphore* pSignalSemaphore)
    {
        VERIFY_EXPR(pSignalSemaphore != nullptr);
        m_SignalManagedSemaphores.emplace_back(pSignalSemaphore);
        m_VkSignalSemaphores.push_back(pSignalSemaphore->Get());
        m_SignalSemaphoreValues.push_back(0); // Ignored for binary semaphore
    }